

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall
edition_unittest::TestMutualRecursionA_SubGroup::ByteSizeLong(TestMutualRecursionA_SubGroup *this)

{
  uint uVar1;
  uint32_t *puVar2;
  size_t sVar3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestMutualRecursionA_SubGroup *this_;
  TestMutualRecursionA_SubGroup *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = 0;
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sStack_58 = google::protobuf::internal::WireFormatLite::
                  MessageSize<edition_unittest::TestMutualRecursionA_SubMessage>
                            ((this->field_0)._impl_.sub_message_);
      sStack_58 = sStack_58 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestAllTypes>((this->field_0)._impl_.not_in_this_scc_);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestMutualRecursionA_SubGroup::ByteSizeLong() const {
  const TestMutualRecursionA_SubGroup& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestMutualRecursionA.SubGroup)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // .edition_unittest.TestMutualRecursionA.SubMessage sub_message = 3;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.sub_message_);
    }
    // .edition_unittest.TestAllTypes not_in_this_scc = 4;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.not_in_this_scc_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}